

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

void __thiscall
dg::vr::GraphBuilder::buildBranch(GraphBuilder *this,BranchInst *inst,VRLocation *last)

{
  mapped_type pVVar1;
  bool bVar2;
  VRLocation *this_00;
  VRLocation *this_01;
  sockaddr *psVar3;
  sockaddr *__addr;
  mapped_type *ppVVar4;
  socklen_t in_ECX;
  socklen_t sVar5;
  socklen_t __len;
  VRLocation *pVVar6;
  VRLocation *in_RDX;
  VRLocation *firstFalse;
  VRLocation *firstTrue;
  Value *condition;
  VRLocation *falsePadding;
  VRLocation *truePadding;
  VRLocation *first;
  undefined8 in_stack_ffffffffffffff08;
  uint uVar7;
  VRCodeGraph *in_stack_ffffffffffffff10;
  VRLocation *this_02;
  VRAssumeBool *in_stack_ffffffffffffff20;
  key_type *in_stack_ffffffffffffff48;
  map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
  *in_stack_ffffffffffffff50;
  
  uVar7 = (uint)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  bVar2 = llvm::BranchInst::isUnconditional((BranchInst *)0x1bca9c);
  if (bVar2) {
    llvm::BranchInst::getSuccessor((BranchInst *)in_stack_ffffffffffffff10,uVar7);
    ppVVar4 = std::
              map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
              ::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    pVVar1 = *ppVVar4;
    psVar3 = (sockaddr *)operator_new(0x10);
    VRNoop::VRNoop((VRNoop *)in_stack_ffffffffffffff10);
    VRLocation::connect(in_RDX,(int)pVVar1,psVar3,in_ECX);
  }
  else {
    this_00 = VRCodeGraph::newVRLocation(in_stack_ffffffffffffff10);
    pVVar6 = this_00;
    this_01 = VRCodeGraph::newVRLocation(in_stack_ffffffffffffff10);
    sVar5 = (socklen_t)pVVar6;
    llvm::BranchInst::getCondition((BranchInst *)0x1bcb82);
    pVVar6 = in_RDX;
    this_02 = this_00;
    psVar3 = (sockaddr *)operator_new(0x20);
    VRAssumeBool::VRAssumeBool
              (in_stack_ffffffffffffff20,(Value *)psVar3,SUB81((ulong)this_02 >> 0x38,0));
    VRLocation::connect(pVVar6,(int)this_02,psVar3,sVar5);
    uVar7 = (uint)((ulong)pVVar6 >> 0x20);
    __addr = (sockaddr *)operator_new(0x20);
    VRAssumeBool::VRAssumeBool
              ((VRAssumeBool *)in_RDX,(Value *)psVar3,SUB81((ulong)this_02 >> 0x38,0));
    VRLocation::connect(in_RDX,(int)this_01,__addr,sVar5);
    llvm::BranchInst::getSuccessor((BranchInst *)this_02,uVar7);
    ppVVar4 = std::
              map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
              ::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    sVar5 = (socklen_t)*ppVVar4;
    __len = sVar5;
    llvm::BranchInst::getSuccessor((BranchInst *)this_02,uVar7);
    ppVVar4 = std::
              map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
              ::operator[](in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    pVVar1 = *ppVVar4;
    psVar3 = (sockaddr *)operator_new(0x10);
    VRNoop::VRNoop((VRNoop *)this_02);
    VRLocation::connect(this_00,sVar5,psVar3,__len);
    psVar3 = (sockaddr *)operator_new(0x10);
    VRNoop::VRNoop((VRNoop *)this_02);
    VRLocation::connect(this_01,(int)pVVar1,psVar3,__len);
  }
  return;
}

Assistant:

void GraphBuilder::buildBranch(const llvm::BranchInst *inst, VRLocation &last) {
    if (inst->isUnconditional()) {
        assert(fronts.find(inst->getSuccessor(0)) != fronts.end());
        VRLocation &first = *fronts[inst->getSuccessor(0)];

        last.connect(first, new VRNoop());
    } else {
        VRLocation &truePadding = codeGraph.newVRLocation();
        VRLocation &falsePadding = codeGraph.newVRLocation();

        auto *condition = inst->getCondition();
        last.connect(truePadding, new VRAssumeBool(condition, true));
        last.connect(falsePadding, new VRAssumeBool(condition, false));

        assert(fronts.find(inst->getSuccessor(0)) != fronts.end());
        assert(fronts.find(inst->getSuccessor(1)) != fronts.end());

        VRLocation &firstTrue = *fronts[inst->getSuccessor(0)];
        VRLocation &firstFalse = *fronts[inst->getSuccessor(1)];

        truePadding.connect(firstTrue, new VRNoop());
        falsePadding.connect(firstFalse, new VRNoop());
    }
}